

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::FileTimeSet(char *fname,cmSystemToolsFileTime *t)

{
  int iVar1;
  cmSystemToolsFileTime *t_local;
  char *fname_local;
  
  iVar1 = utime(fname,(utimbuf *)t);
  return -1 < iVar1;
}

Assistant:

bool cmSystemTools::FileTimeSet(const char* fname, cmSystemToolsFileTime* t)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  cmSystemToolsWindowsHandle h =
    CreateFileW(SystemTools::ConvertToWindowsExtendedPath(fname).c_str(),
                FILE_WRITE_ATTRIBUTES, 0, 0, OPEN_EXISTING,
                FILE_FLAG_BACKUP_SEMANTICS, 0);
  if(!h)
    {
    return false;
    }
  if(!SetFileTime(h, &t->timeCreation, &t->timeLastAccess, &t->timeLastWrite))
    {
    return false;
    }
#else
  if(utime(fname, &t->timeBuf) < 0)
    {
    return false;
    }
#endif
  return true;
}